

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O3

bool __thiscall arm::Operand2::operator==(Operand2 *this,Operand2 *other)

{
  _Array_type *__vtable;
  bool __ret;
  bool local_69;
  anon_class_16_2_9763bfdf_conflict1 local_68;
  _Variadic_union<arm::RegisterOperand,_int> local_58;
  __index_type local_48;
  undefined1 local_40 [16];
  __index_type local_30;
  
  local_30 = *(__index_type *)
              ((long)&(this->super_variant<arm::RegisterOperand,_int>).
                      super__Variant_base<arm::RegisterOperand,_int>.
                      super__Move_assign_alias<arm::RegisterOperand,_int>.
                      super__Copy_assign_alias<arm::RegisterOperand,_int>.
                      super__Move_ctor_alias<arm::RegisterOperand,_int>.
                      super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                      super__Variant_storage_alias<arm::RegisterOperand,_int> + 0x10);
  local_58._M_first._M_storage.super_Displayable._vptr_Displayable = (Displayable)local_40;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
    ::_S_vtable._M_arr[(long)(char)local_30 + 1]._M_data)
            ((anon_class_8_1_a78179b7_conflict8 *)&local_58._M_first,
             &this->super_variant<arm::RegisterOperand,_int>);
  local_48 = *(__index_type *)
              ((long)&(other->super_variant<arm::RegisterOperand,_int>).
                      super__Variant_base<arm::RegisterOperand,_int>.
                      super__Move_assign_alias<arm::RegisterOperand,_int>.
                      super__Copy_assign_alias<arm::RegisterOperand,_int>.
                      super__Move_ctor_alias<arm::RegisterOperand,_int>.
                      super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                      super__Variant_storage_alias<arm::RegisterOperand,_int> + 0x10);
  local_68.__ret = (bool *)&local_58;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
    ::_S_vtable._M_arr[(long)(char)local_48 + 1]._M_data)
            ((anon_class_8_1_a78179b7_conflict8 *)&local_68,
             &other->super_variant<arm::RegisterOperand,_int>);
  local_68.__ret = &local_69;
  local_69 = true;
  local_68.__lhs = (variant<arm::RegisterOperand,_int> *)local_40;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
    ::_S_vtable._M_arr[(long)(char)local_48 + 1]._M_data)
            (&local_68,(variant<arm::RegisterOperand,_int> *)&local_58._M_first);
  return local_69;
}

Assistant:

bool operator==(const Operand2& other) const {
    auto this_ =
        dynamic_cast<const std::variant<RegisterOperand, int32_t>&>(*this);
    auto other_ =
        dynamic_cast<const std::variant<RegisterOperand, int32_t>&>(other);
    return this_ == other_;
  }